

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O1

t_int * tabreceive_perform(t_int *w)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  size_t __n;
  long lVar6;
  void *__s;
  long lVar7;
  long lVar8;
  
  __s = (void *)w[2];
  uVar2 = w[3];
  lVar3 = *(long *)(w[1] + 0x30);
  iVar5 = (int)uVar2;
  if (lVar3 == 0) {
    if (iVar5 == 0) goto LAB_001193d3;
    __n = (uVar2 & 0xffffffff) << 2;
  }
  else {
    iVar1 = *(int *)(w[1] + 0x40);
    lVar4 = (long)iVar1;
    lVar6 = (long)iVar5;
    if (lVar4 <= iVar5) {
      lVar6 = lVar4;
    }
    if (lVar6 != 0) {
      lVar7 = 0;
      lVar8 = 0;
      do {
        *(undefined4 *)((long)__s + lVar8 * 4) = *(undefined4 *)(lVar3 + lVar8 * 8);
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + -4;
      } while (lVar6 != lVar8);
      __s = (void *)((long)__s - lVar7);
    }
    if (iVar5 <= iVar1) goto LAB_001193d3;
    __n = ((long)(uVar2 << 0x20) >> 0x1e) + lVar4 * -4;
  }
  memset(__s,0,__n);
LAB_001193d3:
  return w + 4;
}

Assistant:

static t_int *tabreceive_perform(t_int *w)
{
    t_tabreceive *x = (t_tabreceive *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)w[3];
    t_word *from = x->x_vec;
    if (from)
    {
        t_int vecsize = x->x_npoints;
        if (vecsize > n)
            vecsize = n;
        while (vecsize--)
            *out++ = (from++)->w_float;
        vecsize = n - x->x_npoints;
        if (vecsize > 0)
            while (vecsize--)
                *out++ = 0;
    }
    else while (n--) *out++ = 0;
    return (w+4);
}